

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

int32_t icu_63::CollationFastLatin::compareUTF8
                  (uint16_t *table,uint16_t *primaries,int32_t options,uint8_t *left,
                  int32_t leftLength,uint8_t *right,int32_t rightLength)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint32_t rightQuaternary;
  uint32_t leftQuaternary;
  UChar32 c_9;
  UChar32 c_8;
  uint32_t rightTertiary;
  uint32_t leftTertiary;
  UChar32 c_7;
  UChar32 c_6;
  UBool withCaseBits;
  uint32_t rightCase;
  uint32_t leftCase;
  UChar32 c_5;
  UChar32 c_4;
  UBool strengthIsPrimary;
  uint32_t rightSecondary;
  uint32_t leftSecondary;
  UChar32 c_3;
  UChar32 c_2;
  uint32_t rightPrimary;
  uint32_t leftPrimary;
  uint8_t t_1;
  UChar32 c_1;
  uint32_t uStack_54;
  uint8_t t;
  UChar32 c;
  uint32_t rightPair;
  uint32_t leftPair;
  int32_t rightIndex;
  int32_t leftIndex;
  uint32_t variableTop;
  uint8_t *right_local;
  uint8_t *puStack_30;
  int32_t leftLength_local;
  uint8_t *left_local;
  uint16_t *puStack_20;
  int32_t options_local;
  uint16_t *primaries_local;
  uint16_t *table_local;
  
  primaries_local = table + (int)(*table & 0xff);
  rightIndex = (uint)options >> 0x10;
  left_local._4_4_ = options & 0xffff;
  leftPair = 0;
  rightPair = 0;
  c = 0;
  uStack_54 = 0;
  _leftIndex = right;
  right_local._4_4_ = leftLength;
  puStack_30 = left;
  puStack_20 = primaries;
LAB_0025f645:
  while (c == 0) {
    if (leftPair == right_local._4_4_) {
      c = 2;
      break;
    }
    uVar6 = leftPair + 1;
    c_1 = (UChar32)puStack_30[(int)leftPair];
    if ((uint)c_1 < 0x80) {
      c = (UChar32)puStack_20[c_1];
      leftPair = uVar6;
      if (c != 0) break;
      if ((((uint)c_1 < 0x3a) && (0x2f < (uint)c_1)) && ((left_local._4_4_ & 2) != 0)) {
        return -2;
      }
      c = (UChar32)primaries_local[c_1];
    }
    else if (((((uint)c_1 < 0xc6) && (0xc1 < (uint)c_1)) && (uVar6 != right_local._4_4_)) &&
            ((bVar1 = puStack_30[(int)uVar6], 0x7f < bVar1 && (bVar1 < 0xc0)))) {
      leftPair = leftPair + 2;
      c_1 = (c_1 - 0xc2U) * 0x40 + (uint)bVar1;
      c = (UChar32)puStack_20[c_1];
      if (c != 0) break;
      c = (UChar32)primaries_local[c_1];
    }
    else {
      leftPair = uVar6;
      c = lookupUTF8(primaries_local,c_1,puStack_30,(int32_t *)&leftPair,right_local._4_4_);
    }
    if (0xfff < (uint)c) {
      c = c & 0xfc00;
      break;
    }
    if ((uint)rightIndex < (uint)c) {
      c = c & 0xfff8;
      break;
    }
    uVar6 = nextPair(primaries_local,c_1,c,(UChar *)0x0,puStack_30,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
    if (uVar6 == 1) {
      return -2;
    }
    c = getPrimaries(rightIndex,uVar6);
  }
  while (uStack_54 == 0) {
    if (rightPair == rightLength) {
      uStack_54 = 2;
      break;
    }
    uVar6 = rightPair + 1;
    leftPrimary = (uint32_t)_leftIndex[(int)rightPair];
    if (leftPrimary < 0x80) {
      uStack_54 = (uint32_t)puStack_20[(int)leftPrimary];
      rightPair = uVar6;
      if (uStack_54 != 0) break;
      if (((leftPrimary < 0x3a) && (0x2f < leftPrimary)) && ((left_local._4_4_ & 2) != 0)) {
        return -2;
      }
      uStack_54 = (uint32_t)primaries_local[(int)leftPrimary];
    }
    else if ((((leftPrimary < 0xc6) && (0xc1 < leftPrimary)) && (uVar6 != rightLength)) &&
            ((bVar1 = _leftIndex[(int)uVar6], 0x7f < bVar1 && (bVar1 < 0xc0)))) {
      rightPair = rightPair + 2;
      leftPrimary = (leftPrimary - 0xc2) * 0x40 + (uint)bVar1;
      uStack_54 = (uint32_t)puStack_20[(int)leftPrimary];
      if (uStack_54 != 0) break;
      uStack_54 = (uint32_t)primaries_local[(int)leftPrimary];
    }
    else {
      rightPair = uVar6;
      uStack_54 = lookupUTF8(primaries_local,leftPrimary,_leftIndex,(int32_t *)&rightPair,
                             rightLength);
    }
    if (0xfff < uStack_54) {
      uStack_54 = uStack_54 & 0xfc00;
      break;
    }
    if ((uint)rightIndex < uStack_54) {
      uStack_54 = uStack_54 & 0xfff8;
      break;
    }
    uVar6 = nextPair(primaries_local,leftPrimary,uStack_54,(UChar *)0x0,_leftIndex,
                     (int32_t *)&rightPair,&rightLength);
    if (uVar6 == 1) {
      return -2;
    }
    uStack_54 = getPrimaries(rightIndex,uVar6);
  }
  if (c == uStack_54) {
    if (c != 2) {
      uStack_54 = 0;
      c = 0;
      goto LAB_0025f645;
    }
  }
  else {
    if ((c & 0xffffU) != (uStack_54 & 0xffff)) {
      if ((c & 0xffffU) < (uStack_54 & 0xffff)) {
        return -1;
      }
      return 1;
    }
    if (c != 2) {
      c = (uint)c >> 0x10;
      uStack_54 = uStack_54 >> 0x10;
      goto LAB_0025f645;
    }
  }
  iVar3 = CollationSettings::getStrength(left_local._4_4_);
  if (iVar3 < 1) goto LAB_0025fcf2;
  rightPair = 0;
  leftPair = 0;
  uStack_54 = 0;
  c = 0;
LAB_0025fa49:
  if (c == 0) {
    if (leftPair == right_local._4_4_) {
      c = 2;
      goto LAB_0025fb51;
    }
    uVar6 = leftPair + 1;
    uVar4 = (uint)puStack_30[(int)leftPair];
    if (uVar4 < 0x80) {
      c = (UChar32)primaries_local[(int)uVar4];
      leftPair = uVar6;
    }
    else if (uVar4 < 0xc6) {
      leftPair = leftPair + 2;
      c = (UChar32)primaries_local[(int)((uVar4 - 0xc2) * 0x40 + (uint)puStack_30[(int)uVar6])];
    }
    else {
      leftPair = uVar6;
      c = lookupUTF8Unsafe(primaries_local,uVar4,puStack_30,(int32_t *)&leftPair);
    }
    if (0xfff < (uint)c) {
      c = getSecondariesFromOneShortCE(c);
      goto LAB_0025fb51;
    }
    if ((uint)rightIndex < (uint)c) {
      c = 0xc0;
      goto LAB_0025fb51;
    }
    uVar6 = nextPair(primaries_local,uVar4,c,(UChar *)0x0,puStack_30,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
    c = getSecondaries(rightIndex,uVar6);
    goto LAB_0025fa49;
  }
LAB_0025fb51:
  while (uStack_54 == 0) {
    if (rightPair == rightLength) {
      uStack_54 = 2;
      break;
    }
    uVar6 = rightPair + 1;
    uVar4 = (uint)_leftIndex[(int)rightPair];
    if (uVar4 < 0x80) {
      uStack_54 = (uint32_t)primaries_local[(int)uVar4];
      rightPair = uVar6;
    }
    else if (uVar4 < 0xc6) {
      rightPair = rightPair + 2;
      uStack_54 = (uint32_t)
                  primaries_local[(int)((uVar4 - 0xc2) * 0x40 + (uint)_leftIndex[(int)uVar6])];
    }
    else {
      rightPair = uVar6;
      uStack_54 = lookupUTF8Unsafe(primaries_local,uVar4,_leftIndex,(int32_t *)&rightPair);
    }
    if (0xfff < uStack_54) {
      uStack_54 = getSecondariesFromOneShortCE(uStack_54);
      break;
    }
    if ((uint)rightIndex < uStack_54) {
      uStack_54 = 0xc0;
      break;
    }
    uVar6 = nextPair(primaries_local,uVar4,uStack_54,(UChar *)0x0,_leftIndex,(int32_t *)&rightPair,
                     &rightLength);
    uStack_54 = getSecondaries(rightIndex,uVar6);
  }
  if (c == uStack_54) {
    if (c == 2) goto LAB_0025fcf2;
    uStack_54 = 0;
    c = 0;
    goto LAB_0025fa49;
  }
  if ((c & 0xffffU) != (uStack_54 & 0xffff)) {
    if ((left_local._4_4_ & 0x800) != 0) {
      return -2;
    }
    if ((c & 0xffffU) < (uStack_54 & 0xffff)) {
      return -1;
    }
    return 1;
  }
  if (c != 2) {
    c = (uint)c >> 0x10;
    uStack_54 = uStack_54 >> 0x10;
    goto LAB_0025fa49;
  }
LAB_0025fcf2:
  if ((left_local._4_4_ & 0x400) != 0) {
    iVar3 = CollationSettings::getStrength(left_local._4_4_);
    rightPair = 0;
    leftPair = 0;
    uStack_54 = 0;
    c = 0;
LAB_0025fd34:
    for (; c == 0; c = getCases(rightIndex,iVar3 == 0,c)) {
      if (leftPair == right_local._4_4_) {
        c = 2;
        break;
      }
      uVar4 = (uint)puStack_30[(int)leftPair];
      if (uVar4 < 0x80) {
        local_b8 = (uint)primaries_local[(int)uVar4];
        leftPair = leftPair + 1;
      }
      else {
        leftPair = leftPair + 1;
        local_b8 = lookupUTF8Unsafe(primaries_local,uVar4,puStack_30,(int32_t *)&leftPair);
      }
      c = local_b8;
      if (local_b8 < 0xc00) {
        c = nextPair(primaries_local,uVar4,local_b8,(UChar *)0x0,puStack_30,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
      }
    }
    for (; uStack_54 == 0; uStack_54 = getCases(rightIndex,iVar3 == 0,uStack_54)) {
      if (rightPair == rightLength) {
        uStack_54 = 2;
        break;
      }
      uVar4 = (uint)_leftIndex[(int)rightPair];
      if (uVar4 < 0x80) {
        local_bc = (uint)primaries_local[(int)uVar4];
        rightPair = rightPair + 1;
      }
      else {
        rightPair = rightPair + 1;
        local_bc = lookupUTF8Unsafe(primaries_local,uVar4,_leftIndex,(int32_t *)&rightPair);
      }
      uStack_54 = local_bc;
      if (local_bc < 0xc00) {
        uStack_54 = nextPair(primaries_local,uVar4,local_bc,(UChar *)0x0,_leftIndex,
                             (int32_t *)&rightPair,&rightLength);
      }
    }
    if (c == uStack_54) {
      if (c == 2) goto LAB_0025ff72;
      uStack_54 = 0;
      c = 0;
      goto LAB_0025fd34;
    }
    uVar4 = c & 0xffff;
    uVar5 = uStack_54 & 0xffff;
    if (uVar4 != uVar5) {
      if ((left_local._4_4_ & 0x100) != 0) {
        if (uVar4 < uVar5) {
          return 1;
        }
        return -1;
      }
      if (uVar4 < uVar5) {
        return -1;
      }
      return 1;
    }
    if (c != 2) {
      c = (uint)c >> 0x10;
      uStack_54 = uStack_54 >> 0x10;
      goto LAB_0025fd34;
    }
  }
LAB_0025ff72:
  iVar3 = CollationSettings::getStrength(left_local._4_4_);
  if (1 < iVar3) {
    UVar2 = CollationSettings::isTertiaryWithCaseBits(left_local._4_4_);
    rightPair = 0;
    leftPair = 0;
    uStack_54 = 0;
    c = 0;
LAB_0025ffb7:
    for (; c == 0; c = getTertiaries(rightIndex,UVar2,c)) {
      if (leftPair == right_local._4_4_) {
        c = 2;
        break;
      }
      uVar4 = (uint)puStack_30[(int)leftPair];
      if (uVar4 < 0x80) {
        local_c0 = (uint)primaries_local[(int)uVar4];
        leftPair = leftPair + 1;
      }
      else {
        leftPair = leftPair + 1;
        local_c0 = lookupUTF8Unsafe(primaries_local,uVar4,puStack_30,(int32_t *)&leftPair);
      }
      c = local_c0;
      if (local_c0 < 0xc00) {
        c = nextPair(primaries_local,uVar4,local_c0,(UChar *)0x0,puStack_30,(int32_t *)&leftPair,
                     (int32_t *)((long)&right_local + 4));
      }
    }
    for (; uStack_54 == 0; uStack_54 = getTertiaries(rightIndex,UVar2,uStack_54)) {
      if (rightPair == rightLength) {
        uStack_54 = 2;
        break;
      }
      uVar4 = (uint)_leftIndex[(int)rightPair];
      if (uVar4 < 0x80) {
        local_c4 = (uint)primaries_local[(int)uVar4];
        rightPair = rightPair + 1;
      }
      else {
        rightPair = rightPair + 1;
        local_c4 = lookupUTF8Unsafe(primaries_local,uVar4,_leftIndex,(int32_t *)&rightPair);
      }
      uStack_54 = local_c4;
      if (local_c4 < 0xc00) {
        uStack_54 = nextPair(primaries_local,uVar4,local_c4,(UChar *)0x0,_leftIndex,
                             (int32_t *)&rightPair,&rightLength);
      }
    }
    if (c == uStack_54) {
      if (c == 2) goto LAB_00260225;
      uStack_54 = 0;
      c = 0;
      goto LAB_0025ffb7;
    }
    c_8 = c & 0xffff;
    c_9 = uStack_54 & 0xffff;
    if (c_8 != c_9) {
      UVar2 = CollationSettings::sortsTertiaryUpperCaseFirst(left_local._4_4_);
      if (UVar2 != '\0') {
        if (3 < (uint)c_8) {
          c_8 = c_8 ^ 0x18;
        }
        if (3 < (uint)c_9) {
          c_9 = c_9 ^ 0x18;
        }
      }
      if ((uint)c_8 < (uint)c_9) {
        return -1;
      }
      return 1;
    }
    if (c != 2) {
      c = (uint)c >> 0x10;
      uStack_54 = uStack_54 >> 0x10;
      goto LAB_0025ffb7;
    }
LAB_00260225:
    iVar3 = CollationSettings::getStrength(left_local._4_4_);
    if (2 < iVar3) {
      rightPair = 0;
      leftPair = 0;
      uStack_54 = 0;
      c = 0;
      do {
        while (c != 0) {
LAB_00260323:
          for (; uStack_54 == 0; uStack_54 = getQuaternaries(rightIndex,uStack_54)) {
            if (rightPair == rightLength) {
              uStack_54 = 2;
              break;
            }
            uVar4 = (uint)_leftIndex[(int)rightPair];
            if (uVar4 < 0x80) {
              local_cc = (uint)primaries_local[(int)uVar4];
              rightPair = rightPair + 1;
            }
            else {
              rightPair = rightPair + 1;
              local_cc = lookupUTF8Unsafe(primaries_local,uVar4,_leftIndex,(int32_t *)&rightPair);
            }
            uStack_54 = local_cc;
            if (local_cc < 0xc00) {
              uStack_54 = nextPair(primaries_local,uVar4,local_cc,(UChar *)0x0,_leftIndex,
                                   (int32_t *)&rightPair,&rightLength);
            }
          }
          if (c == uStack_54) {
            if (c == 2) {
              return 0;
            }
            uStack_54 = 0;
            c = 0;
          }
          else {
            if ((c & 0xffffU) != (uStack_54 & 0xffff)) {
              if ((c & 0xffffU) < (uStack_54 & 0xffff)) {
                return -1;
              }
              return 1;
            }
            if (c == 2) {
              return 0;
            }
            c = (uint)c >> 0x10;
            uStack_54 = uStack_54 >> 0x10;
          }
        }
        if (leftPair == right_local._4_4_) {
          c = 2;
          goto LAB_00260323;
        }
        uVar4 = (uint)puStack_30[(int)leftPair];
        if (uVar4 < 0x80) {
          local_c8 = (uint)primaries_local[(int)uVar4];
          leftPair = leftPair + 1;
        }
        else {
          leftPair = leftPair + 1;
          local_c8 = lookupUTF8Unsafe(primaries_local,uVar4,puStack_30,(int32_t *)&leftPair);
        }
        c = local_c8;
        if (local_c8 < 0xc00) {
          c = nextPair(primaries_local,uVar4,local_c8,(UChar *)0x0,puStack_30,(int32_t *)&leftPair,
                       (int32_t *)((long)&right_local + 4));
        }
        c = getQuaternaries(rightIndex,c);
      } while( true );
    }
  }
  return 0;
}

Assistant:

int32_t
CollationFastLatin::compareUTF8(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const uint8_t *left, int32_t leftLength,
                                 const uint8_t *right, int32_t rightLength) {
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see RuleBasedCollator::getFastLatinOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    // Note: There is no need to assemble the code point.
    // We only need to look up the table entry for the character,
    // and nextPair() looks for whether c==0.
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && leftIndex != leftLength &&
                    0x80 <= (t = left[leftIndex]) && t <= 0xbf) {
                ++leftIndex;
                c = ((c - 0xc2) << 6) + t;
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                leftPair = table[c];
            } else {
                leftPair = lookupUTF8(table, c, left, leftIndex, leftLength);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && rightIndex != rightLength &&
                    0x80 <= (t = right[rightIndex]) && t <= 0xbf) {
                ++rightIndex;
                c = ((c - 0xc2) << 6) + t;
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                rightPair = table[c];
            } else {
                rightPair = lookupUTF8(table, c, right, rightIndex, rightLength);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= 0x7f) {
                    leftPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    leftPair = table[((c - 0xc2) << 6) + left[leftIndex++]];
                } else {
                    leftPair = lookupUTF8Unsafe(table, c, left, leftIndex);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= 0x7f) {
                    rightPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    rightPair = table[((c - 0xc2) << 6) + right[rightIndex++]];
                } else {
                    rightPair = lookupUTF8Unsafe(table, c, right, rightIndex);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}